

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_mtbdd.c
# Opt level: O0

void mtbdd_sha2_rec(MTBDD dd,SHA256_CTX *ctx)

{
  int iVar1;
  uint64_t uVar2;
  MTBDD MVar3;
  uint32_t local_34;
  uint64_t uStack_30;
  uint32_t level;
  uint64_t value;
  mtbddnode_t pmStack_20;
  uint32_t type;
  mtbddnode_t node;
  SHA256_CTX *ctx_local;
  MTBDD dd_local;
  
  node = (mtbddnode_t)ctx;
  ctx_local = (SHA256_CTX *)dd;
  if ((dd == 0x8000000000000000) || (dd == 0)) {
    SHA256_Update((SHA256_CTX *)ctx,&ctx_local,8);
  }
  else {
    pmStack_20 = MTBDD_GETNODE(dd);
    iVar1 = mtbddnode_getmark(pmStack_20);
    if (iVar1 == 0) {
      mtbddnode_setmark(pmStack_20,1);
      iVar1 = mtbddnode_isleaf(pmStack_20);
      if (iVar1 == 0) {
        local_34 = mtbddnode_getvariable(pmStack_20);
        uVar2 = mtbddnode_gethigh(pmStack_20);
        MVar3 = MTBDD_STRIPMARK(uVar2);
        if (MVar3 != 0) {
          local_34 = local_34 | 0x80000000;
        }
        SHA256_Update((SHA256_CTX *)node,&local_34,4);
        uVar2 = mtbddnode_gethigh(pmStack_20);
        mtbdd_sha2_rec(uVar2,(SHA256_CTX *)node);
        uVar2 = mtbddnode_getlow(pmStack_20);
        mtbdd_sha2_rec(uVar2,(SHA256_CTX *)node);
      }
      else {
        value._4_4_ = mtbddnode_gettype(pmStack_20);
        SHA256_Update((SHA256_CTX *)node,(void *)((long)&value + 4),4);
        uStack_30 = mtbddnode_getvalue(pmStack_20);
        uStack_30 = sylvan_mt_hash(value._4_4_,uStack_30,uStack_30);
        SHA256_Update((SHA256_CTX *)node,&stack0xffffffffffffffd0,8);
      }
    }
  }
  return;
}

Assistant:

static void
mtbdd_sha2_rec(MTBDD dd, SHA256_CTX *ctx)
{
    if (dd == mtbdd_true || dd == mtbdd_false) {
        SHA256_Update(ctx, (void*)&dd, sizeof(MTBDD));
        return;
    }

    mtbddnode_t node = MTBDD_GETNODE(dd);
    if (mtbddnode_getmark(node) == 0) {
        mtbddnode_setmark(node, 1);
        if (mtbddnode_isleaf(node)) {
            uint32_t type = mtbddnode_gettype(node);
            SHA256_Update(ctx, (void*)&type, sizeof(uint32_t));
            uint64_t value = mtbddnode_getvalue(node);
            value = sylvan_mt_hash(type, value, value);
            SHA256_Update(ctx, (void*)&value, sizeof(uint64_t));
        } else {
            uint32_t level = mtbddnode_getvariable(node);
            if (MTBDD_STRIPMARK(mtbddnode_gethigh(node))) level |= 0x80000000;
            SHA256_Update(ctx, (void*)&level, sizeof(uint32_t));
            mtbdd_sha2_rec(mtbddnode_gethigh(node), ctx);
            mtbdd_sha2_rec(mtbddnode_getlow(node), ctx);
        }
    }
}